

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

pcap_t * pcap_create_common(char *ebuf,size_t size)

{
  pcap_t *p;
  size_t size_local;
  char *ebuf_local;
  
  ebuf_local = (char *)pcap_alloc_pcap_t(ebuf,size);
  if ((pcap_t *)ebuf_local == (pcap_t *)0x0) {
    ebuf_local = (char *)0x0;
  }
  else {
    ((pcap_t *)ebuf_local)->can_set_rfmon_op = pcap_cant_set_rfmon;
    initialize_ops((pcap_t *)ebuf_local);
    ((pcap_t *)ebuf_local)->snapshot = 0x40000;
    (((pcap_t *)ebuf_local)->opt).timeout = 0;
    (((pcap_t *)ebuf_local)->opt).buffer_size = 0;
    (((pcap_t *)ebuf_local)->opt).promisc = 0;
    (((pcap_t *)ebuf_local)->opt).rfmon = 0;
    (((pcap_t *)ebuf_local)->opt).immediate = 0;
    (((pcap_t *)ebuf_local)->opt).tstamp_type = -1;
    (((pcap_t *)ebuf_local)->opt).tstamp_precision = 0;
    ((pcap_t *)ebuf_local)->bpf_codegen_flags = 0;
  }
  return (pcap_t *)ebuf_local;
}

Assistant:

pcap_t *
pcap_create_common(char *ebuf, size_t size)
{
	pcap_t *p;

	p = pcap_alloc_pcap_t(ebuf, size);
	if (p == NULL)
		return (NULL);

	/*
	 * Default to "can't set rfmon mode"; if it's supported by
	 * a platform, the create routine that called us can set
	 * the op to its routine to check whether a particular
	 * device supports it.
	 */
	p->can_set_rfmon_op = pcap_cant_set_rfmon;

	initialize_ops(p);

	/* put in some defaults*/
 	p->snapshot = MAXIMUM_SNAPLEN;	/* max packet size */
	p->opt.timeout = 0;		/* no timeout specified */
	p->opt.buffer_size = 0;		/* use the platform's default */
	p->opt.promisc = 0;
	p->opt.rfmon = 0;
	p->opt.immediate = 0;
	p->opt.tstamp_type = -1;	/* default to not setting time stamp type */
	p->opt.tstamp_precision = PCAP_TSTAMP_PRECISION_MICRO;

	/*
	 * Start out with no BPF code generation flags set.
	 */
	p->bpf_codegen_flags = 0;

	return (p);
}